

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O0

_Bool dice_test_values(dice_t *dice,int base,int dice_count,int sides,int bonus)

{
  _Bool success;
  int bonus_local;
  int sides_local;
  int dice_count_local;
  int base_local;
  dice_t *dice_local;
  
  return ((dice->b == base && dice->x == dice_count) && dice->y == sides) && dice->m == bonus;
}

Assistant:

bool dice_test_values(const dice_t *dice, int base, int dice_count, int sides,
		int bonus)
{
	bool success = true;
	success &= dice->b == base;
	success &= dice->x == dice_count;
	success &= dice->y == sides;
	success &= dice->m == bonus;
	return success;
}